

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t first_byte_or_zero;
  undefined4 extraout_var;
  FieldDescriptor *field;
  Reflection *this_00;
  uint key;
  Descriptor *this;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  this = (Descriptor *)CONCAT44(extraout_var,iVar4);
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  do {
    pbVar1 = input->buffer_;
    first_byte_or_zero = 0;
    if ((pbVar1 < input->buffer_end_) &&
       (first_byte_or_zero = (uint32_t)*pbVar1, -1 < (char)*pbVar1)) {
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    input->last_tag_ = first_byte_or_zero;
    bVar2 = (first_byte_or_zero & 7) == 4 || first_byte_or_zero == 0;
    if (bVar2) {
      return bVar2;
    }
    if (this == (Descriptor *)0x0) {
LAB_003b6433:
      field = (FieldDescriptor *)0x0;
LAB_003b6435:
      bVar3 = ParseAndMergeField(first_byte_or_zero,field,message,input);
    }
    else {
      key = first_byte_or_zero >> 3;
      field = Descriptor::FindFieldByNumber(this,key);
      if (field != (FieldDescriptor *)0x0) goto LAB_003b6435;
      bVar3 = Descriptor::IsExtensionNumber(this,key);
      if (bVar3) {
        if (input->extension_pool_ == (DescriptorPool *)0x0) {
          field = Reflection::FindKnownExtensionByNumber(this_00,key);
        }
        else {
          field = DescriptorPool::FindExtensionByNumber(input->extension_pool_,this,key);
        }
        if (field != (FieldDescriptor *)0x0) goto LAB_003b6435;
      }
      if (first_byte_or_zero != 0xb) goto LAB_003b6433;
      field = (FieldDescriptor *)0x0;
      if (*(char *)(*(long *)(this + 0x20) + 0x48) == '\0') goto LAB_003b6435;
      bVar3 = ParseAndMergeMessageSetItem(input,message);
    }
    if (bVar3 == false) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = nullptr;

    if (descriptor != nullptr) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == nullptr) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()->FindExtensionByNumber(
              descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == nullptr && descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}